

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ConvertToHalfPass::ProcessImageRef(ConvertToHalfPass *this,Instruction *inst)

{
  initializer_list<unsigned_int> init_list;
  Instruction *this_00;
  size_type sVar1;
  size_type sVar2;
  DefUseManager *this_01;
  uint32_t local_64;
  iterator local_60;
  undefined8 local_58;
  SmallVector<unsigned_int,_2UL> local_50;
  uint32_t local_24;
  Op local_20;
  uint32_t dref_id;
  Instruction *pIStack_18;
  bool modified;
  Instruction *inst_local;
  ConvertToHalfPass *this_local;
  
  dref_id._3_1_ = 0;
  pIStack_18 = inst;
  inst_local = (Instruction *)this;
  local_20 = opt::Instruction::opcode(inst);
  sVar1 = std::
          unordered_set<spv::Op,_spvtools::opt::ConvertToHalfPass::hasher,_std::equal_to<spv::Op>,_std::allocator<spv::Op>_>
          ::count(&this->dref_image_ops_,&local_20);
  if (sVar1 != 0) {
    local_24 = opt::Instruction::GetSingleWordInOperand(pIStack_18,2);
    sVar2 = std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&this->converted_ids_,&local_24);
    if (sVar2 != 0) {
      GenConvert(this,&local_24,0x20,pIStack_18);
      this_00 = pIStack_18;
      local_64 = local_24;
      local_60 = &local_64;
      local_58 = 1;
      init_list._M_len = 1;
      init_list._M_array = local_60;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_50,init_list);
      opt::Instruction::SetInOperand(this_00,2,&local_50);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_50);
      this_01 = Pass::get_def_use_mgr(&this->super_Pass);
      analysis::DefUseManager::AnalyzeInstUse(this_01,pIStack_18);
      dref_id._3_1_ = 1;
    }
  }
  return (bool)(dref_id._3_1_ & 1);
}

Assistant:

bool ConvertToHalfPass::ProcessImageRef(Instruction* inst) {
  bool modified = false;
  // If image reference, only need to convert dref args back to float32
  if (dref_image_ops_.count(inst->opcode()) != 0) {
    uint32_t dref_id = inst->GetSingleWordInOperand(kImageSampleDrefIdInIdx);
    if (converted_ids_.count(dref_id) > 0) {
      GenConvert(&dref_id, 32, inst);
      inst->SetInOperand(kImageSampleDrefIdInIdx, {dref_id});
      get_def_use_mgr()->AnalyzeInstUse(inst);
      modified = true;
    }
  }
  return modified;
}